

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O0

void __thiscall CVmWeakRefable::release_ref(CVmWeakRefable *this)

{
  bool bVar1;
  long lVar2;
  long *in_RDI;
  int del;
  
  OS_Mutex::lock((OS_Mutex *)0x32cbcb);
  bVar1 = false;
  lVar2 = OS_Counter::dec((OS_Counter *)(in_RDI + 1));
  if (lVar2 == 0) {
    if (in_RDI[3] != 0) {
      CVmWeakRef::clear_ref((CVmWeakRef *)in_RDI[3]);
    }
    bVar1 = true;
  }
  OS_Mutex::unlock((OS_Mutex *)0x32cc13);
  if ((bVar1) && (in_RDI != (long *)0x0)) {
    (**(code **)(*in_RDI + 8))();
  }
  return;
}

Assistant:

void CVmWeakRefable::release_ref()
{
    /* lock the object while we're working */
    mu->lock();
    
    /* decrement the reference counter */
    int del = FALSE;
    if (cnt.dec() == 0)
    {
        /* if we have a weak referencer, clear its pointer to me */
        if (weakref != 0)
            weakref->clear_ref();
        
        /* note that it's time to delete the object */
        del = TRUE;
    }
    
    /* done with our lock */
    mu->unlock();
    
    /* if we're unreferenced, delete myself */
    if (del)
        delete this;
}